

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hh
# Opt level: O0

vector<double,_std::allocator<double>_> *
randvector(vector<double,_std::allocator<double>_> *__return_storage_ptr__,int n)

{
  bool bVar1;
  reference pdVar2;
  double dVar3;
  double *x;
  iterator __end1;
  iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  allocator<double> local_16;
  undefined1 local_15;
  int local_14;
  vector<double,_std::allocator<double>_> *pvStack_10;
  int n_local;
  vector<double,_std::allocator<double>_> *v;
  
  local_15 = 0;
  local_14 = n;
  pvStack_10 = __return_storage_ptr__;
  std::allocator<double>::allocator(&local_16);
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,(long)n,&local_16);
  std::allocator<double>::~allocator(&local_16);
  __end1 = std::vector<double,_std::allocator<double>_>::begin(__return_storage_ptr__);
  x = (double *)std::vector<double,_std::allocator<double>_>::end(__return_storage_ptr__);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                     *)&x), bVar1) {
    pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end1);
    dVar3 = randdouble();
    *pdVar2 = dVar3;
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<double> randvector(int n) {
	vector<double> v(n);
	for (double& x : v) x = randdouble();
	return v;
}